

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::GenerateClearBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string varName;
  string mask;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar6 = (uint)this;
  uVar5 = uVar6 + 0x1f;
  if (-1 < (int)uVar6) {
    uVar5 = uVar6;
  }
  GetBitFieldName_abi_cxx11_(&local_b0,(java *)(ulong)(uint)((int)uVar5 >> 5),bitIndex);
  std::__cxx11::string::string
            ((string *)local_50,
             *(char **)(bit_masks + (long)(int)(uVar6 - (uVar5 & 0xffffffe0)) * 8),
             (allocator *)&local_d0);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)local_f0);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_f0,(ulong)local_b0._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateClearBit(int bitIndex) {
  std::string varName = GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " = (" + varName + " & ~" + mask + ")";
  return result;
}